

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environment.cpp
# Opt level: O0

ptr<Function> __thiscall Environment::getFunction(Environment *this,Identifier *ident)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<Function> pVar1;
  undefined1 local_30 [24];
  Identifier *ident_local;
  Environment *this_local;
  
  ident_local = ident;
  this_local = this;
  getMember((Environment *)local_30,ident);
  std::dynamic_pointer_cast<Function,Member>((shared_ptr<Member> *)this);
  std::shared_ptr<Member>::~shared_ptr((shared_ptr<Member> *)local_30);
  pVar1.super___shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Function>)pVar1.super___shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Function> Environment::getFunction(const Identifier &ident) {
    return std::dynamic_pointer_cast<Function>(getMember(ident));
}